

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<Qt::GestureType,_int>_>::Data
          (Data<QHashPrivate::Node<Qt::GestureType,_int>_> *this,
          Data<QHashPrivate::Node<Qt::GestureType,_int>_> *other,size_t reserved)

{
  Node<Qt::GestureType,_int> *key;
  ulong uVar1;
  Span *pSVar2;
  ulong uVar3;
  Node<Qt::GestureType,_int> *pNVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  size_t numBuckets;
  long in_FS_OFFSET;
  R RVar8;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  numBuckets = 0x80;
  if (0x40 < reserved) {
    if (reserved >> 0x3e == 0) {
      lVar5 = 0x3f;
      if (reserved != 0) {
        for (; reserved >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      numBuckets = 1L << (0x41 - ((byte)lVar5 ^ 0x3f) & 0x3f);
    }
    else {
      numBuckets = 0xffffffffffffffff;
    }
  }
  this->numBuckets = numBuckets;
  RVar8 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar8.spans;
  uVar1 = other->numBuckets;
  lVar5 = 0;
  for (uVar6 = 0; uVar6 != uVar1 >> 7; uVar6 = uVar6 + 1) {
    pSVar2 = other->spans;
    for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
      uVar3 = (ulong)pSVar2->offsets[lVar7 + lVar5];
      if (uVar3 != 0xff) {
        key = (Node<Qt::GestureType,_int> *)(pSVar2[uVar6].entries + uVar3);
        local_48.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_48.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = findBucket<Qt::GestureType>(this,(GestureType *)key);
        pNVar4 = Bucket::insert(&local_48);
        *pNVar4 = *key;
      }
    }
    lVar5 = lVar5 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }